

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void ARM_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  MCOperand *pMVar7;
  int64_t iVar8;
  char *pcVar9;
  MCRegisterClass *pMVar10;
  MCOperand *pMVar11;
  MCOperand *pMVar12;
  MCOperand *op;
  ulong uVar13;
  uint64_t uVar14;
  uint uVar15;
  bool bVar16;
  MCInst NewMI;
  MCInst local_360;
  
  uVar5 = MCInst_getOpcode(MI);
  if (0x1b9 < (int)uVar5) {
    if (0x920 < (int)uVar5) {
      if ((int)uVar5 < 0xa24) {
        if (uVar5 != 0x921) {
          if (uVar5 != 0x941) goto LAB_0015e4c5;
          goto LAB_0015e11f;
        }
      }
      else {
        if (uVar5 == 0xa24) {
LAB_0015e1c6:
          pMVar7 = MCInst_getOperand(MI,0);
          uVar6 = MCOperand_getReg(pMVar7);
          if ((uVar6 != 0xc) || (uVar6 = MCInst_getNumOperands(MI), uVar6 < 6)) goto LAB_0015e4c5;
          SStream_concat0(O,"push");
          MCInst_setOpcodePub(MI,0x1aa);
          printPredicateOperand(MI,2,O);
          if (uVar5 == 0xa24) goto LAB_0015e22a;
          goto LAB_0015e071;
        }
        if (uVar5 == 0xaa6) {
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          uVar6 = MCInst_getNumOperands(MI);
          bVar16 = true;
          if (3 < uVar6) {
            bVar16 = true;
            uVar6 = 3;
            do {
              pMVar7 = MCInst_getOperand(MI,uVar6);
              uVar15 = MCOperand_getReg(pMVar7);
              if (uVar15 == uVar5) {
                bVar16 = false;
              }
              uVar6 = uVar6 + 1;
              uVar15 = MCInst_getNumOperands(MI);
            } while (uVar6 < uVar15);
          }
          SStream_concat0(O,"ldm");
          MCInst_setOpcodePub(MI,0x39);
          printPredicateOperand(MI,1,O);
          SStream_concat0(O,anon_var_dwarf_5cfa9 + 0x11);
          pcVar9 = (*MI->csh->get_regname)(uVar5);
          SStream_concat0(O,pcVar9);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar3 = MI->flat_insn->detail;
            puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
            puVar1[0] = '\x01';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            pcVar3 = MI->flat_insn->detail;
            *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar5;
            puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar1 = *puVar1 + '\x01';
          }
          if (bVar16) {
            MI->writeback = true;
            SStream_concat0(O,"!");
          }
          SStream_concat0(O,", ");
          uVar5 = 3;
          goto LAB_0015e379;
        }
        if (uVar5 != 0xaa2) goto LAB_0015e4c5;
      }
LAB_0015e188:
      pMVar7 = MCInst_getOperand(MI,0);
      iVar8 = MCOperand_getImm(pMVar7);
      switch(iVar8) {
      case 0:
        uVar6 = 0x1ab;
        pcVar9 = "nop";
        break;
      case 1:
        uVar6 = 0x1ac;
        pcVar9 = "yield";
        break;
      case 2:
        uVar6 = 0x1ad;
        pcVar9 = "wfe";
        break;
      case 3:
        uVar6 = 0x1ae;
        pcVar9 = "wfi";
        break;
      case 4:
        uVar6 = 0x1af;
        pcVar9 = "sev";
        break;
      case 5:
        uVar14 = ARM_getFeatureBits(MI->csh->mode);
        if ((uVar14 >> 0x2b & 1) == 0) goto switchD_0015e1b2_default;
        uVar6 = 0x1b0;
        pcVar9 = "sevl";
        break;
      default:
switchD_0015e1b2_default:
        printInstruction(MI,O,(MCRegisterInfo *)Info);
        return;
      }
      SStream_concat0(O,pcVar9);
      printPredicateOperand(MI,1,O);
      if (uVar5 == 0x921) {
        SStream_concat0(O,".w");
      }
      MCInst_setOpcodePub(MI,uVar6);
      return;
    }
    if ((int)uVar5 < 0x4e4) {
      if (uVar5 == 0x1ba) {
        pMVar7 = MCInst_getOperand(MI,2);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 != 0xc) goto LAB_0015e4c5;
        pMVar7 = MCInst_getOperand(MI,3);
        iVar8 = MCOperand_getImm(pMVar7);
        if (iVar8 != -4) goto LAB_0015e4c5;
        SStream_concat0(O,"push");
        MCInst_setOpcodePub(MI,0x1aa);
        printPredicateOperand(MI,4,O);
        SStream_concat0(O,"\t{");
        pcVar2 = MI->csh;
        pMVar7 = MCInst_getOperand(MI,1);
        uVar5 = MCOperand_getReg(pMVar7);
        pcVar9 = (*pcVar2->get_regname)(uVar5);
        SStream_concat0(O,pcVar9);
        if (MI->csh->detail == CS_OPT_OFF) goto LAB_0015e4a5;
        pcVar3 = MI->flat_insn->detail;
        puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar5 = 1;
LAB_0015e46d:
        pMVar7 = MCInst_getOperand(MI,uVar5);
        uVar5 = MCOperand_getReg(pMVar7);
        pcVar3 = MI->flat_insn->detail;
        *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar5;
        puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
        *puVar1 = *puVar1 + '\x01';
LAB_0015e4a5:
        SStream_concat0(O,"}");
        return;
      }
      if (uVar5 != 0x4e0) goto LAB_0015e4c5;
LAB_0015e02a:
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 != 0xc) goto LAB_0015e4c5;
      SStream_concat0(O,"vpop");
      uVar5 = 0x1b2;
    }
    else {
      if (uVar5 == 0x4e4) goto LAB_0015e02a;
      if ((uVar5 != 0x87c) && (uVar5 != 0x880)) goto LAB_0015e4c5;
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 != 0xc) goto LAB_0015e4c5;
      SStream_concat0(O,"vpush");
      uVar5 = 0x1b1;
    }
    MCInst_setOpcodePub(MI,uVar5);
    printPredicateOperand(MI,2,O);
LAB_0015e071:
    SStream_concat0(O,anon_var_dwarf_5cfa9 + 0x11);
    uVar5 = 4;
LAB_0015e379:
    printRegisterList(MI,uVar5,O);
    return;
  }
  if ((int)uVar5 < 0xe2) {
    if ((int)uVar5 < 0x94) {
      if (uVar5 == 0x6f) goto LAB_0015e188;
      if (uVar5 != 0x7b) goto LAB_0015e4c5;
    }
    else {
      if (uVar5 == 0x94) {
LAB_0015e11f:
        pMVar7 = MCInst_getOperand(MI,0);
        uVar6 = MCOperand_getReg(pMVar7);
        if ((uVar6 != 0xc) || (uVar6 = MCInst_getNumOperands(MI), uVar6 < 6)) goto LAB_0015e4c5;
        SStream_concat0(O,"pop");
        MCInst_setOpcodePub(MI,0x1a9);
        printPredicateOperand(MI,2,O);
        if (uVar5 == 0x941) {
LAB_0015e22a:
          SStream_concat0(O,".w");
        }
        goto LAB_0015e071;
      }
      if (uVar5 != 0xa5) {
        if (uVar5 != 0xbc) goto LAB_0015e4c5;
        pMVar7 = MCInst_getOperand(MI,2);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 != 0xc) goto LAB_0015e4c5;
        pMVar7 = MCInst_getOperand(MI,4);
        iVar8 = MCOperand_getImm(pMVar7);
        if (((((uint)iVar8 >> 0xc & 1) != 0) ||
            (iVar8 = MCOperand_getImm(pMVar7), ((uint)iVar8 & 0xfff) != 4)) &&
           (iVar8 = MCOperand_getImm(pMVar7), iVar8 != 4)) goto LAB_0015e4c5;
        SStream_concat0(O,"pop");
        MCInst_setOpcodePub(MI,0x1a9);
        printPredicateOperand(MI,5,O);
        SStream_concat0(O,"\t{");
        pcVar2 = MI->csh;
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        pcVar9 = (*pcVar2->get_regname)(uVar5);
        SStream_concat0(O,pcVar9);
        if (MI->csh->detail == CS_OPT_OFF) goto LAB_0015e4a5;
        pcVar3 = MI->flat_insn->detail;
        puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar5 = 0;
        goto LAB_0015e46d;
      }
    }
  }
  else {
    if ((int)uVar5 < 0x192) {
      if (uVar5 == 0xe2) {
        pMVar7 = MCInst_getOperand(MI,0);
        pMVar11 = MCInst_getOperand(MI,1);
        pMVar12 = MCInst_getOperand(MI,2);
        iVar8 = MCOperand_getImm(pMVar12);
        uVar5 = ((uint)iVar8 & 7) - 1;
        if (uVar5 < 5) {
          pcVar9 = *(char **)(&DAT_0028b4d0 + (ulong)uVar5 * 8);
        }
        else {
          pcVar9 = anon_var_dwarf_d9c84 + 0x11;
        }
        SStream_concat0(O,pcVar9);
        printSBitModifierOperand(MI,5,O);
        printPredicateOperand(MI,3,O);
        SStream_concat0(O,anon_var_dwarf_5cfa9 + 0x11);
        pcVar2 = MI->csh;
        uVar5 = MCOperand_getReg(pMVar7);
        pcVar9 = (*pcVar2->get_regname)(uVar5);
        SStream_concat0(O,pcVar9);
        if (MI->csh->detail != CS_OPT_OFF) {
          pcVar3 = MI->flat_insn->detail;
          puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar5 = MCOperand_getReg(pMVar7);
          pcVar3 = MI->flat_insn->detail;
          *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar5;
          puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
          *puVar1 = *puVar1 + '\x01';
        }
        SStream_concat0(O,", ");
        pcVar2 = MI->csh;
        uVar5 = MCOperand_getReg(pMVar11);
        pcVar9 = (*pcVar2->get_regname)(uVar5);
        SStream_concat0(O,pcVar9);
        if (MI->csh->detail != CS_OPT_OFF) {
          pcVar3 = MI->flat_insn->detail;
          puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar5 = MCOperand_getReg(pMVar11);
          pcVar3 = MI->flat_insn->detail;
          *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar5;
          puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
          *puVar1 = *puVar1 + '\x01';
        }
        iVar8 = MCOperand_getImm(pMVar12);
        if (((uint)iVar8 & 7) == 5) {
          return;
        }
        SStream_concat0(O,", ");
        uVar13 = MCOperand_getImm(pMVar12);
        uVar5 = 0x20;
        if (7 < (uint)uVar13) {
          uVar5 = (uint)(uVar13 >> 3) & 0x1fffffff;
        }
        pcVar9 = ", #%u";
        if (9 < uVar5) {
          pcVar9 = ", #0x%x";
        }
        SStream_concat(O,pcVar9 + 2,(ulong)uVar5);
        if (MI->csh->detail == CS_OPT_OFF) {
          return;
        }
        iVar8 = MCOperand_getImm(pMVar12);
        pcVar3 = MI->flat_insn->detail;
        *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x12) =
             (uint)iVar8 & 7;
        pcVar3 = MI->flat_insn->detail;
        *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x16) = uVar5;
        return;
      }
      if (uVar5 == 0xe3) {
        pMVar7 = MCInst_getOperand(MI,0);
        pMVar11 = MCInst_getOperand(MI,1);
        pMVar12 = MCInst_getOperand(MI,2);
        op = MCInst_getOperand(MI,3);
        iVar8 = MCOperand_getImm(op);
        uVar5 = ((uint)iVar8 & 7) - 1;
        if (uVar5 < 5) {
          pcVar9 = *(char **)(&DAT_0028b4d0 + (ulong)uVar5 * 8);
        }
        else {
          pcVar9 = anon_var_dwarf_d9c84 + 0x11;
        }
        SStream_concat0(O,pcVar9);
        printSBitModifierOperand(MI,6,O);
        printPredicateOperand(MI,4,O);
        SStream_concat0(O,anon_var_dwarf_5cfa9 + 0x11);
        pcVar2 = MI->csh;
        uVar5 = MCOperand_getReg(pMVar7);
        pcVar9 = (*pcVar2->get_regname)(uVar5);
        SStream_concat0(O,pcVar9);
        if (MI->csh->detail != CS_OPT_OFF) {
          pcVar3 = MI->flat_insn->detail;
          puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar5 = MCOperand_getReg(pMVar7);
          pcVar3 = MI->flat_insn->detail;
          *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar5;
          puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
          *puVar1 = *puVar1 + '\x01';
        }
        SStream_concat0(O,", ");
        pcVar2 = MI->csh;
        uVar5 = MCOperand_getReg(pMVar11);
        pcVar9 = (*pcVar2->get_regname)(uVar5);
        SStream_concat0(O,pcVar9);
        if (MI->csh->detail != CS_OPT_OFF) {
          pcVar3 = MI->flat_insn->detail;
          puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar5 = MCOperand_getReg(pMVar11);
          pcVar3 = MI->flat_insn->detail;
          *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar5;
          puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
          *puVar1 = *puVar1 + '\x01';
        }
        SStream_concat0(O,", ");
        pcVar2 = MI->csh;
        uVar5 = MCOperand_getReg(pMVar12);
        pcVar9 = (*pcVar2->get_regname)(uVar5);
        SStream_concat0(O,pcVar9);
        if (MI->csh->detail == CS_OPT_OFF) {
          return;
        }
        pcVar3 = MI->flat_insn->detail;
        puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar5 = MCOperand_getReg(pMVar12);
        pcVar3 = MI->flat_insn->detail;
        *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar5;
        puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
        *puVar1 = *puVar1 + '\x01';
        return;
      }
      goto LAB_0015e4c5;
    }
    if (uVar5 != 0x192) {
      if (uVar5 == 0x198) goto LAB_0015e1c6;
      if (uVar5 != 0x1ad) goto LAB_0015e4c5;
    }
  }
  pMVar10 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,1);
  pMVar7 = MCInst_getOperand(MI,(uint)(uVar5 == 0x192 || uVar5 == 0x1ad));
  uVar6 = MCOperand_getReg(pMVar7);
  _Var4 = MCRegisterClass_contains(pMVar10,uVar6);
  if (_Var4) {
    MCInst_Init(&local_360);
    MCInst_setOpcode(&local_360,uVar5);
    if ((uVar5 == 0x1ad) || (uVar15 = 2, uVar5 == 0x192)) {
      pMVar7 = MCInst_getOperand(MI,0);
      MCInst_addOperand2(&local_360,pMVar7);
      uVar15 = 3;
    }
    pMVar10 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x12);
    uVar5 = MCRegisterInfo_getMatchingSuperReg((MCRegisterInfo *)Info,uVar6,9,pMVar10);
    MCOperand_CreateReg0(&local_360,uVar5);
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar15 < uVar5) {
      do {
        pMVar7 = MCInst_getOperand(MI,uVar15);
        MCInst_addOperand2(&local_360,pMVar7);
        uVar15 = uVar15 + 1;
        uVar5 = MCInst_getNumOperands(MI);
      } while (uVar15 < uVar5);
    }
    printInstruction(&local_360,O,(MCRegisterInfo *)Info);
    if (_Var4) {
      return;
    }
  }
LAB_0015e4c5:
  printInstruction(MI,O,(MCRegisterInfo *)Info);
  return;
}

Assistant:

void ARM_printInst(MCInst *MI, SStream *O, void *Info)
{
	MCRegisterInfo *MRI = (MCRegisterInfo *)Info;

	unsigned Opcode = MCInst_getOpcode(MI), tmp, i, pubOpcode;

	switch(Opcode) {
		// Check for HINT instructions w/ canonical names.
		case ARM_HINT:
		case ARM_tHINT:
		case ARM_t2HINT:
			switch (MCOperand_getImm(MCInst_getOperand(MI, 0))) {
				case 0: SStream_concat0(O, "nop"); pubOpcode = ARM_INS_NOP; break;
				case 1: SStream_concat0(O, "yield"); pubOpcode = ARM_INS_YIELD; break;
				case 2: SStream_concat0(O, "wfe"); pubOpcode = ARM_INS_WFE; break;
				case 3: SStream_concat0(O, "wfi"); pubOpcode = ARM_INS_WFI; break;
				case 4: SStream_concat0(O, "sev"); pubOpcode = ARM_INS_SEV; break;
				case 5:
						if ((ARM_getFeatureBits(MI->csh->mode) & ARM_HasV8Ops)) {
							SStream_concat0(O, "sevl");
							pubOpcode = ARM_INS_SEVL;
							break;
						}
						// Fallthrough for non-v8
				default:
						// Anything else should just print normally.
						printInstruction(MI, O, MRI);
						return;
			}
			printPredicateOperand(MI, 1, O);
			if (Opcode == ARM_t2HINT)
				SStream_concat0(O, ".w");

			MCInst_setOpcodePub(MI, pubOpcode);

			return;

			// Check for MOVs and print canonical forms, instead.
		case ARM_MOVsr: {
							// FIXME: Thumb variants?
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);
							MCOperand *MO3 = MCInst_getOperand(MI, 3);

							SStream_concat0(O, ARM_AM_getShiftOpcStr(ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO3))));
							printSBitModifierOperand(MI, 6, O);
							printPredicateOperand(MI, 4, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));

							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO2));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO2);
								MI->flat_insn->detail->arm.op_count++;
							}
							//assert(ARM_AM_getSORegOffset(MO3.getImm()) == 0);
							return;
						}

		case ARM_MOVsi: {
							// FIXME: Thumb variants?
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);

							SStream_concat0(O, ARM_AM_getShiftOpcStr(ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2))));
							printSBitModifierOperand(MI, 5, O);
							printPredicateOperand(MI, 3, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.op_count++;
							}

							if (ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2)) == ARM_AM_rrx) {
								//printAnnotation(O, Annot);
								return;
							}

							SStream_concat0(O, ", ");
							tmp = translateShiftImm(getSORegOffset((unsigned int)MCOperand_getImm(MO2)));
							if (tmp > HEX_THRESHOLD)
								SStream_concat(O, "#0x%x", tmp);
							else
								SStream_concat(O, "#%u", tmp);
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type =
									(arm_shifter)ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2));
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = tmp;
							}
							return;
						}

						// A8.6.123 PUSH
		case ARM_STMDB_UPD:
		case ARM_t2STMDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print PUSH if there are at least two registers in the list.
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2STMDB_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_STR_PRE_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP &&
								MCOperand_getImm(MCInst_getOperand(MI, 3)) == -4) {
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 4, O);
							SStream_concat0(O, "\t{");
							printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 1)));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 1));
								MI->flat_insn->detail->arm.op_count++;
							}
							SStream_concat0(O, "}");
							return;
						}
						break;

						// A8.6.122 POP
		case ARM_LDMIA_UPD:
		case ARM_t2LDMIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print POP if there are at least two registers in the list.
							SStream_concat0(O, "pop");
							MCInst_setOpcodePub(MI, ARM_INS_POP);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2LDMIA_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_LDR_POST_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP) {
							MCOperand *MO2 = MCInst_getOperand(MI, 4);
							if ((getAM2Op((unsigned int)MCOperand_getImm(MO2)) == ARM_AM_add &&
										getAM2Offset((unsigned int)MCOperand_getImm(MO2)) == 4) ||
									MCOperand_getImm(MO2) == 4) {
								SStream_concat0(O, "pop");
								MCInst_setOpcodePub(MI, ARM_INS_POP);
								printPredicateOperand(MI, 5, O);
								SStream_concat0(O, "\t{");
								printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 0)));
								if (MI->csh->detail) {
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 0));
									MI->flat_insn->detail->arm.op_count++;
								}
								SStream_concat0(O, "}");
								return;
							}
						}
						break;

						// A8.6.355 VPUSH
		case ARM_VSTMSDB_UPD:
		case ARM_VSTMDDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpush");
							MCInst_setOpcodePub(MI, ARM_INS_VPUSH);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

						// A8.6.354 VPOP
		case ARM_VLDMSIA_UPD:
		case ARM_VLDMDIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpop");
							MCInst_setOpcodePub(MI, ARM_INS_VPOP);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_tLDMIA: {
							 bool Writeback = true;
							 unsigned BaseReg = MCOperand_getReg(MCInst_getOperand(MI, 0));
							 unsigned i;
							 for (i = 3; i < MCInst_getNumOperands(MI); ++i) {
								 if (MCOperand_getReg(MCInst_getOperand(MI, i)) == BaseReg)
									 Writeback = false;
							 }

							 SStream_concat0(O, "ldm");
							 MCInst_setOpcodePub(MI, ARM_INS_LDM);

							 printPredicateOperand(MI, 1, O);
							 SStream_concat0(O, "\t");
							 printRegName(MI->csh, O, BaseReg);
							 if (MI->csh->detail) {
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = BaseReg;
								 MI->flat_insn->detail->arm.op_count++;
							 }
							 if (Writeback) {
								 MI->writeback = true;
								 SStream_concat0(O, "!");
							 }
							 SStream_concat0(O, ", ");
							 printRegisterList(MI, 3, O);
							 return;
						 }

						 // Combine 2 GPRs from disassember into a GPRPair to match with instr def.
						 // ldrexd/strexd require even/odd GPR pair. To enforce this constraint,
						 // a single GPRPair reg operand is used in the .td file to replace the two
						 // GPRs. However, when decoding them, the two GRPs cannot be automatically
						 // expressed as a GPRPair, so we have to manually merge them.
						 // FIXME: We would really like to be able to tablegen'erate this.
		case ARM_LDREXD:
		case ARM_STREXD:
		case ARM_LDAEXD:
		case ARM_STLEXD: {
				MCRegisterClass* MRC = MCRegisterInfo_getRegClass(MRI, ARM_GPRRegClassID);
				bool isStore = Opcode == ARM_STREXD || Opcode == ARM_STLEXD;

				unsigned Reg = MCOperand_getReg(MCInst_getOperand(MI, isStore ? 1 : 0));
				if (MCRegisterClass_contains(MRC, Reg)) {
				    MCInst NewMI;

				    MCInst_Init(&NewMI);
				    MCInst_setOpcode(&NewMI, Opcode);

				    if (isStore)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, 0));

				    MCOperand_CreateReg0(&NewMI, MCRegisterInfo_getMatchingSuperReg(MRI, Reg, ARM_gsub_0,
								MCRegisterInfo_getRegClass(MRI, ARM_GPRPairRegClassID)));

				    // Copy the rest operands into NewMI.
				    for(i = isStore ? 3 : 2; i < MCInst_getNumOperands(MI); ++i)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, i));

				    printInstruction(&NewMI, O, MRI);
				    return;
				}
		 }
	}

	//if (printAliasInstr(MI, O, MRI))
	//	printInstruction(MI, O, MRI);
	printInstruction(MI, O, MRI);
}